

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O1

void chrono::fea::ChMeshFileLoader::FromAbaqusFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChContinuumMaterial> *my_material,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>_>
               *node_sets,ChVector<double> *pos_transform,ChMatrix33<double> *rot_transform,
               bool discard_unused_nodes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *peVar9;
  ChMesh *pCVar10;
  double dVar11;
  double dVar12;
  _Alloc_hider _Var13;
  size_type sVar14;
  ChNodeFEAxyzP *pCVar15;
  char cVar16;
  int iVar17;
  ChLog *pCVar18;
  ChStreamOutAscii *pCVar19;
  istream *piVar20;
  ulong uVar21;
  mapped_type *pmVar22;
  ChElementTetraCorot_4 *pCVar23;
  _Base_ptr p_Var24;
  long *plVar25;
  ChException *pCVar26;
  pointer_____offset_0x10___ *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  ChNodeFEAbase *__tmp;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  _Alloc_hider _Var31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  size_type *psVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>,_bool>
  pVar42;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode_1;
  string token;
  string line;
  shared_ptr<chrono::fea::ChNodeFEAxyzP> mnode;
  string s_node_set_1;
  map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
  parsed_nodes;
  double tokenvals [20];
  string s_node_set;
  ifstream fin;
  ChVector<double> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  undefined1 local_8b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  ulong local_898;
  ChNodeFEAxyzP *local_890;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_888;
  shared_ptr<chrono::fea::ChMesh> *local_880;
  double local_878;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_870;
  double local_868;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Base_ptr local_858;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_850;
  shared_ptr<chrono::fea::ChElementBase> local_840;
  element_type *local_830;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_828;
  undefined8 local_820;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_818;
  undefined8 local_810;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_808;
  double local_800;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7f8;
  pointer local_7f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7e8;
  shared_ptr<chrono::fea::ChElementBase> local_7e0;
  element_type *local_7d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  pointer local_7c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7b8;
  undefined8 local_7b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7a8;
  double local_7a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_798;
  undefined8 local_790;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_788;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_780;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_770;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>_>
  *local_760;
  ChVector<double> *local_758;
  ChMatrix33<double> *local_750;
  string local_748;
  undefined8 uStack_728;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_720;
  undefined8 uStack_718;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_710;
  ios_base local_6d0 [264];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
  local_5c8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [5];
  string local_438;
  string local_418;
  string local_3f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
  local_3d8 [2];
  ios_base local_360 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5c8._M_impl.super__Rb_tree_header._M_header;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_880 = mesh;
  local_760 = node_sets;
  local_758 = pos_transform;
  local_750 = rot_transform;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::ifstream::ifstream(local_238,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_748,filename,(allocator *)local_4d8);
    std::operator+(&local_3d8[0].first,"ERROR opening Abaqus .inp file: ",&local_748);
    plVar25 = (long *)std::__cxx11::string::append((char *)local_3d8);
    local_4f8._M_dataplus._M_p = (pointer)*plVar25;
    psVar34 = (size_type *)(plVar25 + 2);
    if ((size_type *)local_4f8._M_dataplus._M_p == psVar34) {
      local_4f8.field_2._M_allocated_capacity = *psVar34;
      local_4f8.field_2._8_8_ = plVar25[3];
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    }
    else {
      local_4f8.field_2._M_allocated_capacity = *psVar34;
    }
    local_4f8._M_string_length = plVar25[1];
    *plVar25 = (long)psVar34;
    plVar25[1] = 0;
    *(undefined1 *)(plVar25 + 2) = 0;
    ChException::ChException(pCVar26,&local_4f8);
    __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
  }
  pCVar18 = GetLog();
  pCVar19 = ChStreamOutAscii::operator<<
                      (&pCVar18->super_ChStreamOutAscii,"Parsing Abaqus INP file: ");
  pCVar19 = ChStreamOutAscii::operator<<(pCVar19,filename);
  ChStreamOutAscii::operator<<(pCVar19,"\n");
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  local_8b8._M_string_length = 0;
  local_8b8.field_2._M_local_buf[0] = '\0';
  local_858 = (_Base_ptr)0x0;
  uVar29 = 0;
LAB_0061aaeb:
  do {
    do {
      local_898 = uVar29;
      cVar16 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                               (char)(istream *)local_238);
      piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_8b8,cVar16);
      _Var13._M_p = local_8b8._M_dataplus._M_p;
      if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) {
        if ((discard_unused_nodes) &&
           ((_Rb_tree_header *)local_5c8._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_5c8._M_impl.super__Rb_tree_header)) {
          p_Var24 = local_5c8._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (*(char *)&p_Var24[1]._M_right == '\x01') {
              pCVar10 = (local_880->
                        super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_850.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)p_Var24[1]._M_parent;
              local_850.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var24[1]._M_left
              ;
              if ((_Base_ptr)
                  local_850.
                  super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&((_Base_ptr)
                           local_850.
                           super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_parent =
                       *(int *)&((_Base_ptr)
                                local_850.
                                super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&((_Base_ptr)
                           local_850.
                           super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_parent =
                       *(int *)&((_Base_ptr)
                                local_850.
                                super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_parent + 1;
                }
              }
              ChMesh::AddNode(pCVar10,&local_850);
              if ((_Base_ptr)
                  local_850.
                  super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_850.
                           super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
            }
            p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
          } while ((_Rb_tree_header *)p_Var24 != &local_5c8._M_impl.super__Rb_tree_header);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
          operator_delete(local_8b8._M_dataplus._M_p,
                          CONCAT71(local_8b8.field_2._M_allocated_capacity._1_7_,
                                   local_8b8.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(local_238);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
        ::~_Rb_tree(&local_5c8);
        return;
      }
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_8b8._M_dataplus._M_p + local_8b8._M_string_length);
      _Var31._M_p = local_8b8._M_dataplus._M_p;
      if (0 < (long)local_8b8._M_string_length >> 2) {
        _Var31._M_p = local_8b8._M_dataplus._M_p + (local_8b8._M_string_length & 0xfffffffffffffffc)
        ;
        lVar28 = ((long)local_8b8._M_string_length >> 2) + 1;
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_8b8._M_dataplus._M_p + 3);
        do {
          iVar17 = isspace((uint)(byte)paVar32->_M_local_buf[-3]);
          if (iVar17 == 0) {
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar32->_M_local_buf + -3);
            goto LAB_0061abfc;
          }
          iVar17 = isspace((uint)(byte)paVar32->_M_local_buf[-2]);
          if (iVar17 == 0) {
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar32->_M_local_buf + -2);
            goto LAB_0061abfc;
          }
          iVar17 = isspace((uint)(byte)paVar32->_M_local_buf[-1]);
          if (iVar17 == 0) {
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar32->_M_local_buf + -1);
            goto LAB_0061abfc;
          }
          iVar17 = isspace((uint)(byte)paVar32->_M_local_buf[0]);
          if (iVar17 == 0) goto LAB_0061abfc;
          lVar28 = lVar28 + -1;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar32->_M_local_buf + 4);
        } while (1 < lVar28);
      }
      lVar28 = (long)paVar1 - (long)_Var31._M_p;
      if (lVar28 == 1) {
LAB_0061abd9:
        iVar17 = isspace((uint)(byte)*_Var31._M_p);
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var31._M_p;
        if (iVar17 != 0) {
          paVar32 = paVar1;
        }
      }
      else if (lVar28 == 2) {
LAB_0061abc9:
        iVar17 = isspace((uint)(byte)*_Var31._M_p);
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var31._M_p;
        if (iVar17 != 0) {
          _Var31._M_p = _Var31._M_p + 1;
          goto LAB_0061abd9;
        }
      }
      else {
        paVar32 = paVar1;
        if ((lVar28 == 3) &&
           (iVar17 = isspace((uint)(byte)*_Var31._M_p),
           paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var31._M_p, iVar17 != 0)) {
          _Var31._M_p = _Var31._M_p + 1;
          goto LAB_0061abc9;
        }
      }
LAB_0061abfc:
      if (paVar1 == paVar32) {
        local_8b8._M_string_length = 0;
        *_Var13._M_p = 0;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_8b8,0);
      }
      sVar14 = local_8b8._M_string_length;
      _Var13._M_p = local_8b8._M_dataplus._M_p;
      if (local_8b8._M_string_length != 0) {
        uVar29 = 0;
        do {
          iVar17 = toupper((uint)(byte)_Var13._M_p[uVar29]);
          _Var13._M_p[uVar29] = (byte)iVar17;
          uVar29 = uVar29 + 1;
        } while (sVar14 != uVar29);
      }
      uVar29 = local_898;
    } while (*local_8b8._M_dataplus._M_p == 0);
    if (*local_8b8._M_dataplus._M_p != 0x2a) {
      if ((int)local_898 == 1) {
        local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
        local_8e0._M_string_length = 0;
        local_8e0.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3d8,(string *)&local_8b8,_S_in);
        for (uVar29 = 0;
            (piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_3d8,(string *)&local_8e0,','),
            ((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) == 0 && (uVar29 < 0x14))
            ; uVar29 = uVar29 + 1) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_748,(string *)&local_8e0,_S_in);
          std::istream::_M_extract<double>((double *)&local_748);
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_748);
          std::ios_base::~ios_base(local_6d0);
        }
        if (uVar29 != 4) {
          pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_748,
                         "ERROR in .inp file, nodes require ID and three x y z coords, see line:\n",
                         &local_8b8);
          plVar25 = (long *)std::__cxx11::string::append((char *)&local_748);
          local_538._M_dataplus._M_p = (pointer)*plVar25;
          psVar34 = (size_type *)(plVar25 + 2);
          if ((size_type *)local_538._M_dataplus._M_p == psVar34) {
            local_538.field_2._M_allocated_capacity = *psVar34;
            local_538.field_2._8_8_ = plVar25[3];
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          }
          else {
            local_538.field_2._M_allocated_capacity = *psVar34;
          }
          local_538._M_string_length = plVar25[1];
          *plVar25 = (long)psVar34;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ChException::ChException(pCVar26,&local_538);
          __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
        }
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_4d8[0]._M_string_length;
        if ((((double)local_4d8[0]._M_string_length == -1e+31) &&
            (!NAN((double)local_4d8[0]._M_string_length))) ||
           (((double)local_4d8[0].field_2._0_8_ == -1e+31 &&
            (!NAN((double)local_4d8[0].field_2._0_8_))))) {
LAB_0061c264:
          pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_748,"ERROR in .inp file, in parsing x,y,z coordinates of node: \n",
                         &local_8b8);
          plVar25 = (long *)std::__cxx11::string::append((char *)&local_748);
          local_558._M_dataplus._M_p = (pointer)*plVar25;
          psVar34 = (size_type *)(plVar25 + 2);
          if ((size_type *)local_558._M_dataplus._M_p == psVar34) {
            local_558.field_2._M_allocated_capacity = *psVar34;
            local_558.field_2._8_8_ = plVar25[3];
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
          }
          else {
            local_558.field_2._M_allocated_capacity = *psVar34;
          }
          local_558._M_string_length = plVar25[1];
          *plVar25 = (long)psVar34;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ChException::ChException(pCVar26,&local_558);
          __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
        }
        auVar41._8_8_ = 0;
        auVar41._0_8_ = local_4d8[0].field_2._8_8_;
        if (((double)local_4d8[0].field_2._8_8_ == -1e+31) &&
           (!NAN((double)local_4d8[0].field_2._8_8_))) goto LAB_0061c264;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0];
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             (double)local_4d8[0].field_2._0_8_ *
             (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        auVar2 = vfmadd231sd_fma(auVar37,auVar40,auVar2);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2];
        auVar2 = vfmadd231sd_fma(auVar2,auVar41,auVar3);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[3];
        auVar38._8_8_ = 0;
        auVar38._0_8_ =
             (double)local_4d8[0].field_2._0_8_ *
             (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar3 = vfmadd231sd_fma(auVar38,auVar40,auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5];
        auVar3 = vfmadd231sd_fma(auVar3,auVar41,auVar5);
        local_870 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8[0].field_2._0_8_;
        local_868 = (double)local_4d8[0]._M_string_length;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
        auVar39._8_8_ = 0;
        auVar39._0_8_ =
             (double)local_4d8[0].field_2._0_8_ *
             (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar40 = vfmadd231sd_fma(auVar39,auVar40,auVar6);
        local_878 = (double)local_4d8[0].field_2._8_8_;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (local_750->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8];
        auVar40 = vfmadd231sd_fma(auVar40,auVar41,auVar7);
        local_748._M_dataplus._M_p = (pointer)(auVar2._0_8_ + local_758->m_data[0]);
        local_748._M_string_length = (size_type)(auVar3._0_8_ + local_758->m_data[1]);
        local_748.field_2._M_allocated_capacity = (size_type)(auVar40._0_8_ + local_758->m_data[2]);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_4d8[0]._M_dataplus._M_p;
        uVar30 = vcvttsd2usi_avx512f(auVar8);
        peVar9 = (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar9 == (element_type *)0x0) {
          bVar35 = true;
        }
        else {
          lVar28 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                  &ChContinuumElastic::typeinfo,0);
          bVar35 = lVar28 == 0;
        }
        if (bVar35) {
          p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var33 = (my_material->
                    super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
            }
          }
        }
        if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
        }
        if (bVar35) {
          peVar9 = (my_material->
                   super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          if (peVar9 == (element_type *)0x0) {
            bVar35 = true;
          }
          else {
            lVar28 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                    &ChContinuumPoisson3D::typeinfo,0);
            bVar35 = lVar28 == 0;
          }
          if (bVar35) {
            p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var33 = (my_material->
                      super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
              }
            }
          }
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
          }
          if (bVar35) {
            pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_418,
                       "ERROR in .inp generation. Material type not supported. \n","");
            ChException::ChException(pCVar26,&local_418);
            __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
          }
          local_8f8.m_data[0] = local_868;
          local_8f8.m_data[1] = (double)local_870;
          local_8f8.m_data[2] = local_878;
          local_890 = (ChNodeFEAxyzP *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChNodeFEAxyzP,std::allocator<chrono::fea::ChNodeFEAxyzP>,chrono::ChVector<double>>
                    (&local_888,&local_890,(allocator<chrono::fea::ChNodeFEAxyzP> *)&local_8b9,
                     &local_8f8);
          (*(local_890->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[4])(local_890,(ulong)uVar30);
          _Var27._M_pi = local_888._M_pi;
          pCVar15 = local_890;
          if (local_888._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_888._M_pi)->_M_use_count = (local_888._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_888._M_pi)->_M_use_count = (local_888._M_pi)->_M_use_count + 1;
            }
          }
          local_8f8.m_data[0] = (double)CONCAT44(local_8f8.m_data[0]._4_4_,uVar30);
          pmVar22 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::operator[]((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                                  *)&local_5c8,(key_type *)&local_8f8);
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &pCVar15->super_ChNodeFEAbase;
          p_Var33 = (pmVar22->first).
                    super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Var27._M_pi;
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
          }
          uVar29 = local_898;
          pmVar22->second = false;
          _Var27._M_pi = local_888._M_pi;
          if (!discard_unused_nodes) {
            pCVar10 = (local_880->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_780.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = &local_890->super_ChNodeFEAbase;
            local_780.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = local_888._M_pi;
            if (local_888._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_888._M_pi)->_M_use_count = (local_888._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_888._M_pi)->_M_use_count = (local_888._M_pi)->_M_use_count + 1;
              }
            }
            ChMesh::AddNode(pCVar10,&local_780);
            _Var27._M_pi = local_888._M_pi;
            if (local_780.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_780.
                         super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var27._M_pi = local_888._M_pi;
            }
          }
        }
        else {
          local_8f8.m_data[0] = 0.0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8f8.m_data + 1),
                     (ChNodeFEAxyz **)&local_8f8,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_890,
                     (ChVector<double> *)&local_748);
          (*((ChElementTetrahedron *)local_8f8.m_data[0])->_vptr_ChElementTetrahedron[4])
                    (local_8f8.m_data[0],(ulong)uVar30);
          dVar12 = local_8f8.m_data[1];
          dVar11 = local_8f8.m_data[0];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
            }
          }
          local_890 = (ChNodeFEAxyzP *)CONCAT44(local_890._4_4_,uVar30);
          pmVar22 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::operator[]((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                                  *)&local_5c8,(key_type *)&local_890);
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)dVar11;
          p_Var33 = (pmVar22->first).
                    super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar12;
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
          }
          uVar29 = local_898;
          pmVar22->second = false;
          _Var27._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1];
          if (!discard_unused_nodes) {
            pCVar10 = (local_880->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_770.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_8f8.m_data[0];
            local_770.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
              }
            }
            ChMesh::AddNode(pCVar10,&local_770);
            _Var27._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1];
            if (local_770.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_770.
                         super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var27._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1];
            }
          }
        }
        if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var27._M_pi);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3d8);
        std::ios_base::~ios_base(local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
          operator_delete(local_8e0._M_dataplus._M_p,
                          CONCAT71(local_8e0.field_2._M_allocated_capacity._1_7_,
                                   local_8e0.field_2._M_local_buf[0]) + 1);
        }
      }
      if (((uint)uVar29 & 0xfffffffe) == 2) {
        local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
        local_8e0._M_string_length = 0;
        local_8e0.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3d8,(string *)&local_8b8,_S_in);
        for (uVar29 = 0;
            (piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_3d8,(string *)&local_8e0,','),
            ((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) == 0 && (uVar29 < 0x14))
            ; uVar29 = uVar29 + 1) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_748,(string *)&local_8e0,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&local_748);
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_748);
          std::ios_base::~ios_base(local_6d0);
        }
        if ((int)local_898 == 2) {
          if (uVar29 != 5) {
            pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+(&local_748,
                           "ERROR in .inp file, tetrahedrons require ID and 4 node IDs, see line:\n"
                           ,&local_8b8);
            plVar25 = (long *)std::__cxx11::string::append((char *)&local_748);
            local_598._M_dataplus._M_p = (pointer)*plVar25;
            psVar34 = (size_type *)(plVar25 + 2);
            if ((size_type *)local_598._M_dataplus._M_p == psVar34) {
              local_598.field_2._M_allocated_capacity = *psVar34;
              local_598.field_2._8_8_ = plVar25[3];
              local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
            }
            else {
              local_598.field_2._M_allocated_capacity = *psVar34;
            }
            local_598._M_string_length = plVar25[1];
            *plVar25 = (long)psVar34;
            plVar25[1] = 0;
            *(undefined1 *)(plVar25 + 2) = 0;
            ChException::ChException(pCVar26,&local_598);
            __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
          }
        }
        else if (((int)local_898 == 3) && (uVar29 != 0xb)) {
          pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_748,
                         "ERROR in .inp file, tetrahedrons require ID and 10 node IDs, see line:\n",
                         &local_8b8);
          plVar25 = (long *)std::__cxx11::string::append((char *)&local_748);
          local_578._M_dataplus._M_p = (pointer)*plVar25;
          psVar34 = (size_type *)(plVar25 + 2);
          if ((size_type *)local_578._M_dataplus._M_p == psVar34) {
            local_578.field_2._M_allocated_capacity = *psVar34;
            local_578.field_2._8_8_ = plVar25[3];
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
          }
          else {
            local_578.field_2._M_allocated_capacity = *psVar34;
          }
          local_578._M_string_length = plVar25[1];
          *plVar25 = (long)psVar34;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ChException::ChException(pCVar26,&local_578);
          __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
        }
        peVar9 = (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar9 == (element_type *)0x0) {
          bVar35 = false;
        }
        else {
          lVar28 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                  &ChContinuumElastic::typeinfo,0);
          bVar35 = lVar28 != 0;
        }
        if (bVar35) {
          p_Var33 = (my_material->
                    super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        bVar36 = true;
        if (!bVar35) {
          peVar9 = (my_material->
                   super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          if (peVar9 == (element_type *)0x0) {
            bVar36 = false;
          }
          else {
            lVar28 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                    &ChContinuumPoisson3D::typeinfo);
            bVar36 = lVar28 != 0;
          }
          if (bVar36) {
            local_860 = (my_material->
                        super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
            if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_860->_M_use_count = local_860->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_860->_M_use_count = local_860->_M_use_count + 1;
              }
            }
          }
          else {
            local_860 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
        }
        if (!bVar35 && local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
        }
        if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
        }
        if (!bVar36) {
          pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_438,"ERROR in .inp generation. Material type not supported.\n"
                     ,"");
          ChException::ChException(pCVar26,&local_438);
          __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
        }
        local_748._M_dataplus._M_p = (pointer)0x0;
        local_748._M_string_length = 0;
        local_748.field_2._M_allocated_capacity = 0;
        local_748.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uStack_728 = 0;
        p_Stack_720 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uStack_718 = 0;
        p_Stack_710 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        lVar28 = 1;
        psVar34 = &local_748._M_string_length;
        do {
          local_8f8.m_data[0] =
               (double)CONCAT44(local_8f8.m_data[0]._4_4_,
                                *(undefined4 *)((long)&local_4d8[0]._M_dataplus._M_p + lVar28 * 4));
          pmVar22 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::at((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                          *)&local_5c8,(key_type *)&local_8f8);
          (((string *)(psVar34 + -1))->_M_dataplus)._M_p =
               (pointer)(pmVar22->first).
                        super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          __r = (pointer_____offset_0x10___ *)
                &(pmVar22->first).
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)psVar34,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r);
          pmVar22->second = true;
          psVar34 = psVar34 + 2;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 5);
        peVar9 = (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar9 == (element_type *)0x0) {
          bVar35 = true;
        }
        else {
          __r = &ChContinuumMaterial::typeinfo;
          lVar28 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                  &ChContinuumElastic::typeinfo,0);
          bVar35 = lVar28 == 0;
        }
        if (bVar35) {
          p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var33 = (my_material->
                    super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
            }
          }
        }
        if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
        }
        if (bVar35) {
          peVar9 = (my_material->
                   super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          if (peVar9 == (element_type *)0x0) {
            bVar35 = true;
          }
          else {
            __r = &ChContinuumMaterial::typeinfo;
            lVar28 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                    &ChContinuumPoisson3D::typeinfo,0);
            bVar35 = lVar28 == 0;
          }
          if (bVar35) {
            p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var33 = (my_material->
                      super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var33->_M_use_count = p_Var33->_M_use_count + 1;
              }
            }
          }
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
          }
          if (!bVar35) {
            pCVar23 = (ChElementTetraCorot_4 *)
                      ChElementTetraCorot_4_P::operator_new
                                ((ChElementTetraCorot_4_P *)0x1c0,(size_t)__r);
            ChElementTetraCorot_4_P::ChElementTetraCorot_4_P((ChElementTetraCorot_4_P *)pCVar23);
            local_8f8.m_data[0] = (double)pCVar23;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::fea::ChElementTetraCorot_4_P*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8f8.m_data + 1),
                       (ChElementTetraCorot_4_P *)pCVar23);
            local_7f0 = local_748._M_dataplus._M_p;
            local_7e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._M_string_length;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_748._M_string_length + 8) =
                     *(_Atomic_word *)(local_748._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_748._M_string_length + 8) =
                     *(_Atomic_word *)(local_748._M_string_length + 8) + 1;
              }
            }
            local_800 = (double)local_748.field_2._M_allocated_capacity;
            local_7f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748.field_2._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748.field_2._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_748.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_748.field_2._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_748.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_748.field_2._8_8_ + 8) + 1;
              }
            }
            local_810 = uStack_728;
            local_808 = p_Stack_720;
            if (p_Stack_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_720->_M_use_count = p_Stack_720->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_720->_M_use_count = p_Stack_720->_M_use_count + 1;
              }
            }
            local_820 = uStack_718;
            local_818 = p_Stack_710;
            if (p_Stack_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_710->_M_use_count = p_Stack_710->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_710->_M_use_count = p_Stack_710->_M_use_count + 1;
              }
            }
            (*((ChElementTetrahedron *)local_8f8.m_data[0])->_vptr_ChElementTetrahedron[0x16])
                      (local_8f8.m_data[0],&local_7f0,&local_800,&local_810,&local_820);
            if (local_818 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_818);
            }
            if (local_808 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_808);
            }
            if (local_7f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7f8);
            }
            if (local_7e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7e8);
            }
            local_830 = (my_material->
                        super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
            local_828._M_pi =
                 (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_828._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
              }
            }
            (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               *)((long)local_8f8.m_data[0] + 0xa0))->
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_830;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_8f8.m_data[0] + 0xb8),&local_828);
            if (local_828._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_828._M_pi);
            }
            pCVar10 = (local_880->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_840.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_8f8.m_data[0];
            local_840.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
              }
            }
            ChMesh::AddElement(pCVar10,&local_840);
            _Var27._M_pi = local_840.
                           super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            goto LAB_0061be39;
          }
        }
        else {
          pCVar23 = (ChElementTetraCorot_4 *)
                    ChElementTetraCorot_4::operator_new((ChElementTetraCorot_4 *)0x1c0,(size_t)__r);
          ChElementTetraCorot_4::ChElementTetraCorot_4(pCVar23);
          local_8f8.m_data[0] = (double)pCVar23;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChElementTetraCorot_4*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8f8.m_data + 1),pCVar23);
          local_790 = uStack_718;
          local_788 = p_Stack_710;
          if (p_Stack_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_710->_M_use_count = p_Stack_710->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_710->_M_use_count = p_Stack_710->_M_use_count + 1;
            }
          }
          local_7a0 = (double)local_748.field_2._M_allocated_capacity;
          local_798 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748.field_2._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748.field_2._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_748.field_2._8_8_ + 8) =
                   *(_Atomic_word *)(local_748.field_2._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_748.field_2._8_8_ + 8) =
                   *(_Atomic_word *)(local_748.field_2._8_8_ + 8) + 1;
            }
          }
          local_7b0 = uStack_728;
          local_7a8 = p_Stack_720;
          if (p_Stack_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_720->_M_use_count = p_Stack_720->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_720->_M_use_count = p_Stack_720->_M_use_count + 1;
            }
          }
          local_7c0 = local_748._M_dataplus._M_p;
          local_7b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_748._M_string_length + 8) =
                   *(_Atomic_word *)(local_748._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_748._M_string_length + 8) =
                   *(_Atomic_word *)(local_748._M_string_length + 8) + 1;
            }
          }
          (*((ChElementTetrahedron *)local_8f8.m_data[0])->_vptr_ChElementTetrahedron[7])
                    (local_8f8.m_data[0],&local_790,&local_7a0,&local_7b0,&local_7c0);
          if (local_7b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8);
          }
          if (local_7a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7a8);
          }
          if (local_798 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_798);
          }
          if (local_788 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_788);
          }
          local_7d0 = (element_type *)
                      (my_material->
                      super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
          local_7c8._M_pi =
               (my_material->
               super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_7c8._M_pi)->_M_use_count = (local_7c8._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_7c8._M_pi)->_M_use_count = (local_7c8._M_pi)->_M_use_count + 1;
            }
          }
          (((shared_ptr<chrono::fea::ChContinuumElastic> *)((long)local_8f8.m_data[0] + 0xb8))->
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               local_7d0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(((shared_ptr<chrono::fea::ChContinuumElastic> *)
                       ((long)local_8f8.m_data[0] + 0xb8))->
                      super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount,&local_7c8);
          if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
          }
          pCVar10 = (local_880->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          local_7e0.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)((long)local_8f8.m_data[0] + 8);
          if ((ChElementTetraCorot_4 *)local_8f8.m_data[0] == (ChElementTetraCorot_4 *)0x0) {
            local_7e0.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
          }
          local_7e0.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_8f8.m_data[1] + 8) + 1;
            }
          }
          ChMesh::AddElement(pCVar10,&local_7e0);
          _Var27._M_pi = local_7e0.
                         super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
LAB_0061be39:
          if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var27._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8.m_data[1]);
          }
        }
        lVar28 = 0x40;
        do {
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_750 + lVar28) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_750 + lVar28)
                      );
          }
          lVar28 = lVar28 + -0x10;
        } while (lVar28 != 0);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3d8);
        std::ios_base::~ios_base(local_360);
        uVar29 = local_898;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
          operator_delete(local_8e0._M_dataplus._M_p,
                          CONCAT71(local_8e0.field_2._M_allocated_capacity._1_7_,
                                   local_8e0.field_2._M_local_buf[0]) + 1);
          uVar29 = local_898;
        }
      }
      if ((int)uVar29 == 4) {
        local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
        local_8e0._M_string_length = 0;
        local_8e0.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3d8,(string *)&local_8b8,_S_in);
        uVar29 = 0;
        while (((piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_3d8,(string *)&local_8e0,','),
                ((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) == 0 &&
                (uVar29 < 0x14)) &&
               ((local_8e0._M_string_length == 0 ||
                (local_8e0._M_dataplus._M_p[local_8e0._M_string_length - 1] != '\r'))))) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_748,(string *)&local_8e0,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&local_748);
          uVar29 = uVar29 + 1;
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_748);
          std::ios_base::~ios_base(local_6d0);
        }
        if (uVar29 != 0) {
          uVar21 = 0;
          do {
            iVar17 = *(int *)((long)&local_4d8[0]._M_dataplus._M_p + uVar21 * 4);
            if (iVar17 < 1) {
              pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
              std::__cxx11::to_string
                        (&local_748,*(uint *)((long)&local_4d8[0]._M_dataplus._M_p + uVar21 * 4));
              std::operator+(&local_258,"ERROR in .inp file, negative node ID: ",&local_748);
              ChException::ChException(pCVar26,&local_258);
              __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
            }
            local_748._M_dataplus._M_p._0_4_ = iVar17;
            pmVar22 = std::
                      map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                      ::at((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                            *)&local_5c8,(key_type *)&local_748);
            std::
            vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
            ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                         *)local_858,&pmVar22->first);
            pmVar22->second = true;
            uVar21 = uVar21 + 1;
          } while (uVar29 != uVar21);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3d8);
        std::ios_base::~ios_base(local_360);
        uVar29 = local_898;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
          operator_delete(local_8e0._M_dataplus._M_p,
                          CONCAT71(local_8e0.field_2._M_allocated_capacity._1_7_,
                                   local_8e0.field_2._M_local_buf[0]) + 1);
          uVar29 = local_898;
        }
      }
      goto LAB_0061aaeb;
    }
    uVar29 = 0;
    lVar28 = std::__cxx11::string::find((char *)&local_8b8,0x99910e,0);
    if (lVar28 == 0) {
      uVar21 = std::__cxx11::string::find((char *)&local_8b8,0x999114,0);
      uVar29 = 1;
      if (uVar21 != 0) {
        std::__cxx11::string::find((char *)&local_8b8,0xa19f8e,uVar21);
        std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_8b8);
        pCVar18 = GetLog();
        pCVar19 = ChStreamOutAscii::operator<<(&pCVar18->super_ChStreamOutAscii,"| parsing nodes ");
        pCVar19 = ChStreamOutAscii::operator<<(pCVar19,&local_3d8[0].first);
        ChStreamOutAscii::operator<<(pCVar19,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar28 = std::__cxx11::string::find((char *)&local_8b8,0x99912b,0);
    if (lVar28 == 0) {
      uVar21 = std::__cxx11::string::find((char *)&local_8b8,0x999154,0);
      if (uVar21 != 0) {
        std::__cxx11::string::find((char *)&local_8b8,0xa19f8e,uVar21);
        std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_8b8);
        iVar17 = std::__cxx11::string::compare((char *)local_3d8);
        uVar29 = 3;
        if ((iVar17 == 0) ||
           (iVar17 = std::__cxx11::string::compare((char *)local_3d8), iVar17 == 0)) {
          bVar35 = false;
        }
        else {
          iVar17 = std::__cxx11::string::compare((char *)local_3d8);
          bVar35 = iVar17 != 0;
          uVar29 = (ulong)((uint)(iVar17 == 0) * 2);
        }
        if (bVar35) {
          pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_8e0,"ERROR in .inp file, TYPE=",&local_3d8[0].first);
          plVar25 = (long *)std::__cxx11::string::append((char *)&local_8e0);
          local_4d8[0]._M_dataplus._M_p = (pointer)*plVar25;
          psVar34 = (size_type *)(plVar25 + 2);
          if ((size_type *)local_4d8[0]._M_dataplus._M_p == psVar34) {
            local_4d8[0].field_2._0_8_ = *psVar34;
            local_4d8[0].field_2._8_8_ = plVar25[3];
            local_4d8[0]._M_dataplus._M_p = (pointer)&local_4d8[0].field_2;
          }
          else {
            local_4d8[0].field_2._0_8_ = *psVar34;
          }
          local_4d8[0]._M_string_length = plVar25[1];
          *plVar25 = (long)psVar34;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          std::operator+(&local_748,local_4d8,&local_8b8);
          plVar25 = (long *)std::__cxx11::string::append((char *)&local_748);
          local_518._M_dataplus._M_p = (pointer)*plVar25;
          psVar34 = (size_type *)(plVar25 + 2);
          if ((size_type *)local_518._M_dataplus._M_p == psVar34) {
            local_518.field_2._M_allocated_capacity = *psVar34;
            local_518.field_2._8_8_ = plVar25[3];
            local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          }
          else {
            local_518.field_2._M_allocated_capacity = *psVar34;
          }
          local_518._M_string_length = plVar25[1];
          *plVar25 = (long)psVar34;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ChException::ChException(pCVar26,&local_518);
          __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
      }
      uVar21 = std::__cxx11::string::find((char *)&local_8b8,0x999198,0);
      if (uVar21 != 0) {
        std::__cxx11::string::find((char *)&local_8b8,0xa19f8e,uVar21);
        std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_8b8);
        pCVar18 = GetLog();
        pCVar19 = ChStreamOutAscii::operator<<
                            (&pCVar18->super_ChStreamOutAscii,"| parsing element set: ");
        pCVar19 = ChStreamOutAscii::operator<<(pCVar19,&local_3d8[0].first);
        ChStreamOutAscii::operator<<(pCVar19,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar28 = std::__cxx11::string::find((char *)&local_8b8,0x9991b7,0);
    if (lVar28 == 0) {
      uVar21 = std::__cxx11::string::find((char *)&local_8b8,0x999114,5);
      uVar29 = 4;
      if (uVar21 != 0) {
        std::__cxx11::string::find((char *)&local_8b8,0xa19f8e,uVar21);
        std::__cxx11::string::substr((ulong)&local_748,(ulong)&local_8b8);
        pCVar18 = GetLog();
        pCVar19 = ChStreamOutAscii::operator<<
                            (&pCVar18->super_ChStreamOutAscii,"| parsing nodeset: ");
        pCVar19 = ChStreamOutAscii::operator<<(pCVar19,&local_748);
        ChStreamOutAscii::operator<<(pCVar19,"\n");
        local_4d8[0]._M_dataplus._M_p = (pointer)0x0;
        local_4d8[0]._M_string_length = 0;
        local_4d8[0].field_2._M_allocated_capacity = (pointer)0x0;
        local_3d8[0].first._M_dataplus._M_p = (pointer)&local_3d8[0].first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,local_748._M_dataplus._M_p,
                   (long)(_func_int ***)local_748._M_string_length + local_748._M_dataplus._M_p);
        local_3d8[0].second.
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4d8[0]._M_dataplus._M_p;
        local_3d8[0].second.
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4d8[0]._M_string_length;
        local_3d8[0].second.
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4d8[0].field_2._0_8_;
        local_4d8[0]._M_dataplus._M_p = (pointer)0x0;
        local_4d8[0]._M_string_length = 0;
        local_4d8[0].field_2._M_allocated_capacity =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pVar42 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>
                 ::
                 _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>
                             *)local_760,local_3d8);
        local_858 = (_Base_ptr)pVar42.first._M_node;
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ::~vector(&local_3d8[0].second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                   *)local_4d8);
        if (((undefined1  [16])pVar42 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar26 = (ChException *)__cxa_allocate_exception(0x28);
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,
                     "ERROR in .inp file, multiple NSET with same name has been specified\n","");
          ChException::ChException(pCVar26,&local_3f8);
          __cxa_throw(pCVar26,&ChException::typeinfo,ChException::~ChException);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748._M_dataplus._M_p != &local_748.field_2) {
          operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
        }
        local_858 = local_858 + 2;
        uVar29 = 4;
      }
    }
  } while( true );
}

Assistant:

void ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<ChMesh> mesh,
                                      const char* filename,
                                      std::shared_ptr<ChContinuumMaterial> my_material,
                                      std::map<std::string, std::vector<std::shared_ptr<ChNodeFEAbase>>>& node_sets,
                                      ChVector<> pos_transform,
                                      ChMatrix33<> rot_transform,
                                      bool discard_unused_nodes) {
    std::map<unsigned int, std::pair<std::shared_ptr<ChNodeFEAbase>, bool>> parsed_nodes;
    std::vector<std::shared_ptr<ChNodeFEAbase>>* current_nodeset_vector = nullptr;

    enum eChAbaqusParserSection {
        E_PARSE_UNKNOWN = 0,
        E_PARSE_NODES_XYZ,
        E_PARSE_TETS_4,
        E_PARSE_TETS_10,
        E_PARSE_NODESET
    } e_parse_section = E_PARSE_UNKNOWN;

    std::ifstream fin(filename);
    if (fin.good())
        GetLog() << "Parsing Abaqus INP file: " << filename << "\n";
    else
        throw ChException("ERROR opening Abaqus .inp file: " + std::string(filename) + "\n");

    std::string line;
    while (std::getline(fin, line)) {
        // trims white space from the beginning of the string
        line.erase(line.begin(),
                   std::find_if(line.begin(), line.end(), [](unsigned char c) { return !std::isspace(c); }));

        // convert parsed line to uppercase (since string::find is case sensitive and Abaqus INP is not)
        std::for_each(line.begin(), line.end(), [](char& c) { c = toupper(static_cast<unsigned char>(c)); });

        // skip empty lines
        if (line[0] == 0)
            continue;

        // check if the current line opens a new section
        if (line[0] == '*') {
            e_parse_section = E_PARSE_UNKNOWN;

            if (line.find("*NODE") == 0) {
                std::string::size_type nse = line.find("NSET=");
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_node_set = line.substr(nse + 5, ncom - (nse + 5));
                    GetLog() << "| parsing nodes " << s_node_set << "\n";
                }
                e_parse_section = E_PARSE_NODES_XYZ;
            }

            if (line.find("*ELEMENT") == 0) {
                std::string::size_type nty = line.find("TYPE=");
                if (nty > 0) {
                    std::string::size_type ncom = line.find(",", nty);
                    std::string s_ele_type = line.substr(nty + 5, ncom - (nty + 5));
                    e_parse_section = E_PARSE_UNKNOWN;
                    if (s_ele_type == "C3D10") {
                        e_parse_section = E_PARSE_TETS_10;
                    } else if (s_ele_type == "DC3D10") {
                        e_parse_section = E_PARSE_TETS_10;
                    } else if (s_ele_type == "C3D4") {
                        e_parse_section = E_PARSE_TETS_4;
                    }
                    if (e_parse_section == E_PARSE_UNKNOWN) {
                        throw ChException("ERROR in .inp file, TYPE=" + s_ele_type +
                                          " (only C3D10 or DC3D10 or C3D4 tetrahedrons supported) see: \n" + line +
                                          "\n");
                    }
                }
                std::string::size_type nse = line.find("ELSET=");
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_ele_set = line.substr(nse + 6, ncom - (nse + 6));
                    GetLog() << "| parsing element set: " << s_ele_set << "\n";
                }
            }

            if (line.find("*NSET") == 0) {
                std::string::size_type nse = line.find("NSET=", 5);
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_node_set = line.substr(nse + 5, ncom - (nse + 5));
                    GetLog() << "| parsing nodeset: " << s_node_set << "\n";
                    auto new_node =
                        node_sets.insert(std::pair<std::string, std::vector<std::shared_ptr<ChNodeFEAbase>>>(
                            s_node_set, std::vector<std::shared_ptr<ChNodeFEAbase>>()));
                    if (new_node.second) {
                        current_nodeset_vector = &new_node.first->second;
                    } else
                        throw ChException("ERROR in .inp file, multiple NSET with same name has been specified\n");
                }
                e_parse_section = E_PARSE_NODESET;
            }

            continue;
        }

        // node parsing
        if (e_parse_section == E_PARSE_NODES_XYZ) {
            int idnode = 0;
            double x = -10e30;
            double y = -10e30;
            double z = -10e30;
            double tokenvals[20];
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            if (ntoken != 4)
                throw ChException("ERROR in .inp file, nodes require ID and three x y z coords, see line:\n" + line +
                                  "\n");

            x = tokenvals[1];
            y = tokenvals[2];
            z = tokenvals[3];
            if (x == -10e30 || y == -10e30 || z == -10e30)
                throw ChException("ERROR in .inp file, in parsing x,y,z coordinates of node: \n" + line + "\n");

            // TODO: is it worth to keep a so specific routine inside this function?
            // especially considering that is affecting only some types of elements...
            ChVector<> node_position(x, y, z);
            node_position = rot_transform * node_position;  // rotate/scale, if needed
            node_position = pos_transform + node_position;  // move, if needed

            idnode = static_cast<unsigned int>(tokenvals[0]);
            if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material)) {
                auto mnode = chrono_types::make_shared<ChNodeFEAxyz>(node_position);
                mnode->SetIndex(idnode);
                parsed_nodes[idnode] = std::make_pair(mnode, false);
                if (!discard_unused_nodes)
                    mesh->AddNode(mnode);
            } else if (std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                auto mnode = chrono_types::make_shared<ChNodeFEAxyzP>(ChVector<>(x, y, z));
                mnode->SetIndex(idnode);
                parsed_nodes[idnode] = std::make_pair(mnode, false);
                if (!discard_unused_nodes)
                    mesh->AddNode(mnode);
            } else
                throw ChException("ERROR in .inp generation. Material type not supported. \n");
        }

        // element parsing
        if (e_parse_section == E_PARSE_TETS_10 || e_parse_section == E_PARSE_TETS_4) {
            ////int idelem = 0;
            unsigned int tokenvals[20];
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            if (e_parse_section == E_PARSE_TETS_10) {
                if (ntoken != 11)
                    throw ChException("ERROR in .inp file, tetrahedrons require ID and 10 node IDs, see line:\n" +
                                      line + "\n");
                // TODO: 'idelem' might be stored in an index in ChElementBase in order to provide consistency with the
                // INP file
                ////idelem = (int)tokenvals[0];

                for (int in = 0; in < 10; ++in)
                    if (tokenvals[in + 1] == -10e30)
                        throw ChException("ERROR in in .inp file, in parsing IDs of tetrahedron: \n" + line + "\n");
            } else if (e_parse_section == E_PARSE_TETS_4) {
                if (ntoken != 5)
                    throw ChException("ERROR in .inp file, tetrahedrons require ID and 4 node IDs, see line:\n" + line +
                                      "\n");

                // TODO: 'idelem' might be stored in an index in ChElementBase in order to provide consistency with the
                // INP file
                ////idelem = (int)tokenvals[0];

                for (int in = 0; in < 4; ++in)
                    if (tokenvals[in + 1] == -10e30)
                        throw ChException("ERROR in in .inp file, in parsing IDs of tetrahedron: \n" + line + "\n");
            }

            if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material) ||
                std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                std::array<std::shared_ptr<ChNodeFEAbase>, 4> element_nodes;
                for (auto node_sel = 0; node_sel < 4; ++node_sel) {
                    // check if the nodes required by the current element exist
                    std::pair<std::shared_ptr<ChNodeFEAbase>, bool>& node_found =
                        parsed_nodes.at(static_cast<unsigned int>(tokenvals[node_sel + 1]));

                    element_nodes[node_sel] = node_found.first;
                    node_found.second = true;
                }

                if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material)) {
                    auto mel = chrono_types::make_shared<ChElementTetraCorot_4>();
                    mel->SetNodes(std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[3]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[1]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[2]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[0]));
                    mel->SetMaterial(std::static_pointer_cast<ChContinuumElastic>(my_material));
                    mesh->AddElement(mel);

                } else if (std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                    auto mel = chrono_types::make_shared<ChElementTetraCorot_4_P>();
                    mel->SetNodes(std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[0]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[1]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[2]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[3]));
                    mel->SetMaterial(std::static_pointer_cast<ChContinuumPoisson3D>(my_material));
                    mesh->AddElement(mel);
                }

            } else
                throw ChException("ERROR in .inp generation. Material type not supported.\n");
        }

        // parsing nodesets
        if (e_parse_section == E_PARSE_NODESET) {
            unsigned int tokenvals[20];  // strictly speaking, the maximum is 16 nodes for each line
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                if (!token.empty() && token.back() == '\r') {
                    // Fix for possible Windows line ending (\r\n)
                    break;
                }
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            for (auto node_sel = 0; node_sel < ntoken; ++node_sel) {
                auto idnode = static_cast<int>(tokenvals[node_sel]);
                if (idnode > 0) {
                    // check if the nodeset is asking for an existing node
                    std::pair<std::shared_ptr<ChNodeFEAbase>, bool>& node_found =
                        parsed_nodes.at(static_cast<unsigned int>(tokenvals[node_sel]));

                    current_nodeset_vector->push_back(node_found.first);
                    // flag the node to be saved later into the mesh
                    node_found.second = true;

                } else
                    throw ChException("ERROR in .inp file, negative node ID: " + std::to_string(tokenvals[node_sel]));
            }
        }

    }  // end while

    // only used nodes have been saved in 'parsed_nodes_used' and are now inserted in the mesh node list
    if (discard_unused_nodes) {
        for (auto node_it = parsed_nodes.begin(); node_it != parsed_nodes.end(); ++node_it) {
            if (node_it->second.second)
                mesh->AddNode(node_it->second.first);
        }
    }
}